

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O2

void __thiscall kratos::AssertionVisitor::visit(AssertionVisitor *this,AssertBase *stmt)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer ppVar1;
  bool bVar2;
  int iVar3;
  Generator *pGVar4;
  Const *pCVar5;
  AssertValueStmt *st_1;
  long lVar6;
  initializer_list<std::shared_ptr<kratos::Var>_> __l;
  string local_f0;
  undefined1 local_d0 [16];
  undefined1 local_c0 [8];
  shared_ptr<kratos::FunctionCallStmt> else_stmt;
  __shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> local_a0;
  undefined1 local_90 [8];
  shared_ptr<kratos::Var> filename_var;
  shared_ptr<kratos::Var> line_num_var;
  shared_ptr<kratos::GeneratorConst> gen_var;
  shared_ptr<kratos::FunctionCallVar> else_call;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  undefined1 local_40 [8];
  shared_ptr<kratos::AssertPropertyStmt> st;
  
  if ((stmt->super_Stmt).super_IRNode.fn_name_ln.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (stmt->super_Stmt).super_IRNode.fn_name_ln.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pGVar4 = Stmt::generator_parent(&stmt->super_Stmt);
    bVar2 = Generator::has_function(pGVar4,(string *)hgdb_assert_fail_abi_cxx11_);
    if (!bVar2) {
      Generator::builtin_function((Generator *)local_d0,(string *)pGVar4);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d0 + 8));
    }
    ppVar1 = (stmt->super_Stmt).super_IRNode.fn_name_ln.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string((string *)&local_f0,(string *)ppVar1);
    pCVar5 = Const::constant(&local_f0,(int)(ppVar1->first)._M_string_length << 3);
    std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
              ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)local_90,
               (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
               &(pCVar5->super_Var).super_enable_shared_from_this<kratos::Var>);
    std::__cxx11::string::~string((string *)&local_f0);
    pCVar5 = Const::constant((ulong)ppVar1->second,0x20,false);
    std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
              ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
               &filename_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,(__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                &(pCVar5->super_Var).super_enable_shared_from_this<kratos::Var>);
    std::make_shared<kratos::GeneratorConst,kratos::Generator&>
              ((Generator *)
               &line_num_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    pGVar4 = Stmt::generator_parent(&stmt->super_Stmt);
    std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<kratos::GeneratorConst,void>
              ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)local_c0,
               (__shared_ptr<kratos::GeneratorConst,_(__gnu_cxx::_Lock_policy)2> *)
               &line_num_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
               &else_stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_90);
    std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_a0,
               (__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
               &filename_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    __l._M_len = 3;
    __l._M_array = (iterator)local_c0;
    std::vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>::
    vector((vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_> *)
           local_40,__l,
           (allocator_type *)
           &else_call.super___shared_ptr<kratos::FunctionCallVar,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount);
    Generator::call(pGVar4,(string *)hgdb_assert_fail_abi_cxx11_,
                    (vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
                     *)local_40);
    Var::as<kratos::FunctionCallVar>
              ((Var *)&gen_var.
                       super___shared_ptr<kratos::GeneratorConst,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
    std::vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>::
    ~vector((vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_> *)
            local_40);
    lVar6 = 0x28;
    do {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + lVar6));
      lVar6 = lVar6 + -0x10;
    } while (lVar6 != -8);
    std::make_shared<kratos::FunctionCallStmt,std::shared_ptr<kratos::FunctionCallVar>&>
              ((shared_ptr<kratos::FunctionCallVar> *)local_c0);
    iVar3 = (*(stmt->super_Stmt).super_IRNode._vptr_IRNode[0xd])(stmt);
    if (iVar3 == 0) {
      std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<kratos::FunctionCallStmt,void>
                ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)local_40,
                 (__shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2> *)local_c0);
      AssertValueStmt::set_else((AssertValueStmt *)stmt,(shared_ptr<kratos::Stmt> *)local_40);
    }
    else {
      Stmt::as<kratos::AssertPropertyStmt>((Stmt *)local_40);
      if ((*(Property **)((long)local_40 + 0xc0))->action_ == Assert) {
        this_00 = &else_call.super___shared_ptr<kratos::FunctionCallVar,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount;
        std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<kratos::FunctionCallStmt,void>
                  ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)this_00,
                   (__shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2> *)local_c0);
        AssertPropertyStmt::set_else
                  ((AssertPropertyStmt *)local_40,(shared_ptr<kratos::Stmt> *)this_00);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&st);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&else_stmt);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&else_call);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gen_var);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&line_num_var);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&filename_var);
  }
  return;
}

Assistant:

void visit(AssertBase *stmt) override {
        if (stmt->fn_name_ln.empty()) return;
        auto *generator = stmt->generator_parent();
        if (!generator->has_function(hgdb_assert_fail)) {
            generator->builtin_function(hgdb_assert_fail);
        }
        auto const &[filename, line_num] = stmt->fn_name_ln[0];
        auto filename_var = Const::constant(filename, filename.size() * 8).shared_from_this();
        auto line_num_var =
            Const::constant(static_cast<int64_t>(line_num), 32, false).shared_from_this();
        auto gen_var = std::make_shared<GeneratorConst>(*generator);
        auto else_call = stmt->generator_parent()
                             ->call(hgdb_assert_fail, {gen_var, filename_var, line_num_var})
                             .as<FunctionCallVar>();
        auto else_stmt = std::make_shared<FunctionCallStmt>(else_call);
        if (stmt->assert_type() == AssertType::AssertValue) {
            auto *st = reinterpret_cast<AssertValueStmt *>(stmt);
            st->set_else(else_stmt);
        } else {
            auto st = stmt->as<AssertPropertyStmt>();
            auto *prop = st->property();
            if (prop->action() == PropertyAction::Assert) {
                st->set_else(else_stmt);
            }
        }
    }